

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_header.c
# Opt level: O2

exr_result_t scratch_seq_skip(_internal_exr_seq_scratch *scr,int32_t sz)

{
  ulong uVar1;
  exr_result_t eVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  int64_t nread;
  
  eVar2 = -1;
  uVar6 = 0;
  uVar5 = (long)sz;
LAB_001221f6:
  do {
    if (uVar5 == 0) {
LAB_00122267:
      iVar3 = 0;
      if (uVar6 != (long)sz) {
        iVar3 = 10;
      }
      if (eVar2 != -1) {
        iVar3 = eVar2;
      }
      return iVar3;
    }
    uVar1 = scr->navail;
    if ((long)uVar1 < 1) {
      nread = 0;
      eVar2 = (*scr->ctxt->do_read)
                        (scr->ctxt,scr->scratch,0x1000,&scr->fileoff,&nread,EXR_ALLOW_SHORT_READ);
      if (nread < 1) {
        if (nread == 0) {
          eVar2 = (*scr->ctxt->report_error)(scr->ctxt,10,"End of file attempting to read header");
        }
        goto LAB_00122267;
      }
      scr->navail = nread;
      scr->curpos = 0;
      goto LAB_001221f6;
    }
    uVar4 = uVar1;
    if (uVar5 < uVar1) {
      uVar4 = uVar5;
    }
    scr->curpos = scr->curpos + uVar4;
    scr->navail = uVar1 - uVar4;
    uVar5 = uVar5 - uVar4;
    uVar6 = uVar6 + uVar4;
  } while( true );
}

Assistant:

static exr_result_t
scratch_seq_skip (struct _internal_exr_seq_scratch* scr, int32_t sz)
{
    uint64_t     nCopied = 0;
    uint64_t     notdone = (uint64_t) sz;
    exr_result_t rv      = -1;

    while (notdone > 0)
    {
        if (scr->navail > 0)
        {
            uint64_t nLeft = (uint64_t) scr->navail;
            uint64_t nCopy = notdone;
            if (nCopy > nLeft) nCopy = nLeft;
            scr->curpos += nCopy;
            scr->navail -= (int64_t) nCopy;
            notdone -= nCopy;
            nCopied += nCopy;
        }
        else
        {
            int64_t nread = 0;
            rv            = scr->ctxt->do_read (
                scr->ctxt,
                scr->scratch,
                SCRATCH_BUFFER_SIZE,
                &(scr->fileoff),
                &nread,
                EXR_ALLOW_SHORT_READ);
            if (nread > 0)
            {
                scr->navail = nread;
                scr->curpos = 0;
            }
            else
            {
                if (nread == 0)
                    rv = scr->ctxt->report_error (
                        scr->ctxt,
                        EXR_ERR_READ_IO,
                        "End of file attempting to read header");
                break;
            }
        }
    }
    if (rv == -1)
    {
        if (nCopied == (uint64_t) sz)
            rv = EXR_ERR_SUCCESS;
        else
            rv = EXR_ERR_READ_IO;
    }
    return rv;
}